

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
PlayerInfoIRCCommand::trigger
          (PlayerInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  iterator iVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  size_type sVar9;
  pointer pPVar10;
  size_t sVar11;
  reference pPVar12;
  char *pcVar13;
  size_t sVar14;
  __sv_type _Var15;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  size_t local_168;
  char *local_160;
  _List_node_base *local_148;
  char *local_140;
  _Self local_118;
  _Self local_110;
  iterator node_1;
  char *local_100;
  _Self local_e0;
  _Self local_d8;
  iterator node;
  size_t index;
  undefined1 local_90 [8];
  string_view player_info_format;
  Server *server;
  string msg;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  PlayerInfoIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar13 = channel._M_str;
  sVar14 = channel._M_len;
  lVar6 = Jupiter::IRC::Client::getChannel(source,sVar14,pcVar13);
  if (lVar6 != 0) {
    msg.field_2._12_4_ = Jupiter::IRC::Client::Channel::getType();
    std::__cxx11::string::string((string *)&server);
    iVar5 = Jupiter::IRC::Client::getAccessLevel(source,sVar14,pcVar13,nick._M_len,nick._M_str);
    if (iVar5 < 2) {
      _local_90 = RenX_CommandsPlugin::getPlayerInfoFormat(&pluginInstance);
    }
    else {
      _local_90 = RenX_CommandsPlugin::getAdminPlayerInfoFormat(&pluginInstance);
    }
    node._M_node = (_List_node_base *)0x0;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
    if (bVar3) {
      while( true ) {
        iVar1._M_node = node._M_node;
        RenX::getCore();
        p_Var7 = (_List_node_base *)RenX::Core::getServerCount();
        if (iVar1._M_node == p_Var7) break;
        uVar8 = RenX::getCore();
        node._M_node = (_List_node_base *)((long)&(node._M_node)->_M_next + 1);
        player_info_format._M_str = (char *)RenX::Core::getServer(uVar8);
        bVar4 = RenX::Server::isLogChanType((int)player_info_format._M_str);
        if (((bVar4 & 1) != 0) &&
           (sVar9 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                              ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                               (player_info_format._M_str + 0x10)), sVar9 != 0)) {
          local_d8._M_node =
               (_List_node_base *)
               std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                         ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                          (player_info_format._M_str + 0x10));
          while( true ) {
            local_e0._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                           ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                            (player_info_format._M_str + 0x10));
            bVar3 = std::operator==(&local_d8,&local_e0);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            std::__cxx11::string::operator=
                      ((string *)&server,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_90);
            pcVar2 = player_info_format._M_str;
            pPVar12 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_d8);
            RenX::processTags((string *)&server,(Server *)pcVar2,pPVar12,(PlayerInfo *)0x0,
                              (BuildingInfo *)0x0);
            _node_1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&server);
            Jupiter::IRC::Client::sendMessage(source,sVar14,pcVar13,node_1._M_node,local_100);
            std::_List_iterator<RenX::PlayerInfo>::operator++(&local_d8);
          }
        }
      }
    }
    else {
      while( true ) {
        iVar1._M_node = node._M_node;
        RenX::getCore();
        local_148 = (_List_node_base *)RenX::Core::getServerCount();
        if (iVar1._M_node == local_148) break;
        uVar8 = RenX::getCore();
        node._M_node = (_List_node_base *)((long)&(node._M_node)->_M_next + 1);
        player_info_format._M_str = (char *)RenX::Core::getServer(uVar8);
        bVar4 = RenX::Server::isLogChanType((int)player_info_format._M_str);
        if (((bVar4 & 1) != 0) &&
           (sVar9 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                              ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                               (player_info_format._M_str + 0x10)), sVar9 != 0)) {
          local_110._M_node =
               (_List_node_base *)
               std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                         ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                          (player_info_format._M_str + 0x10));
          while( true ) {
            local_118._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                           ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                            (player_info_format._M_str + 0x10));
            bVar3 = std::operator==(&local_110,&local_118);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            pPVar10 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_110);
            bVar16._M_str = (char *)local_148;
            bVar16._M_len = (size_t)parameters._M_str;
            sVar11 = jessilib::findi<char,char>
                               ((jessilib *)&pPVar10->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )parameters._M_len,bVar16);
            if (sVar11 != 0xffffffffffffffff) {
              std::__cxx11::string::operator=
                        ((string *)&server,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_90);
              pcVar2 = player_info_format._M_str;
              pPVar12 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_110);
              RenX::processTags((string *)&server,(Server *)pcVar2,pPVar12,(PlayerInfo *)0x0,
                                (BuildingInfo *)0x0);
              _Var15 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&server);
              local_148 = (_List_node_base *)_Var15._M_len;
              local_140 = _Var15._M_str;
              Jupiter::IRC::Client::sendMessage(source,sVar14,pcVar13,local_148,local_140);
            }
            std::_List_iterator<RenX::PlayerInfo>::operator++(&local_110);
          }
        }
      }
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&server)
    ;
    if (bVar3) {
      bVar16 = sv("Error: Player not found.",0x18);
      local_168 = bVar16._M_len;
      local_160 = bVar16._M_str;
      Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,local_168,local_160);
    }
    std::__cxx11::string::~string((string *)&server);
  }
  return;
}

Assistant:

void PlayerInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		std::string msg;
		RenX::Server *server;
		std::string_view player_info_format = source->getAccessLevel(channel, nick) > 1 ? pluginInstance.getAdminPlayerInfoFormat() : pluginInstance.getPlayerInfoFormat();
		size_t index = 0;

		if (parameters.empty()) { // List all players
			while (index != RenX::getCore()->getServerCount()) {
				server = RenX::getCore()->getServer(index++);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						msg = player_info_format;
						RenX::processTags(msg, server, &*node);
						source->sendMessage(channel, msg);
					}
				}
			}
		}
		else { // List all partial matches
			while (index != RenX::getCore()->getServerCount()) {
				server = RenX::getCore()->getServer(index++);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, std::string_view{parameters}) != std::string::npos) {
							msg = player_info_format;
							RenX::processTags(msg, server, &*node);
							source->sendMessage(channel, msg);
						}
					}
				}
			}
		}

		if (msg.empty()) {
			source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
}